

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O2

char * __thiscall timing::elapsed_time_readable(timing *this)

{
  short sVar1;
  double dVar2;
  
  dVar2 = elapsed_time_seconds(this);
  sVar1 = (short)((long)(int)dVar2 % 0xe10);
  sprintf(this->runtime,"%ih:%im:%is",(long)(int)dVar2 / 0xe10 & 0xffffffff,
          (ulong)(uint)(int)(sVar1 / 0x3c),(ulong)(uint)(int)(sVar1 % 0x3c));
  return this->runtime;
}

Assistant:

char *timing::elapsed_time_readable(){

    double diff_time=elapsed_time_seconds();
    int delta_time=int(diff_time);

    int runtime_hours=delta_time/3600;
    int runtime_minutes=(delta_time % 3600)/60;
    int runtime_seconds=(delta_time % 3600)%60;
    sprintf(runtime,"%ih:%im:%is",runtime_hours,runtime_minutes,runtime_seconds);

    return runtime;

}